

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# OpenSteerDemo.cpp
# Opt level: O0

void OpenSteer::OpenSteerDemo::updateSimulationAndRedraw(void)

{
  float unaff_retaddr;
  float unaff_retaddr_00;
  Clock *in_stack_00000010;
  
  Clock::update(in_stack_00000010);
  initPhaseTimers();
  Clock::getTotalSimulationTime(&clock);
  Clock::getElapsedSimulationTime(&clock);
  updateSelectedPlugIn(unaff_retaddr_00,unaff_retaddr);
  Clock::getTotalRealTime(&clock);
  Clock::getElapsedRealTime(&clock);
  redrawSelectedPlugIn(0.0,1.589129e-39);
  return;
}

Assistant:

void 
OpenSteer::OpenSteerDemo::updateSimulationAndRedraw (void)
{
    // update global simulation clock
    clock.update ();

    //  start the phase timer (XXX to accurately measure "overhead" time this
    //  should be in displayFunc, or somehow account for time outside this
    //  routine)
    initPhaseTimers ();

    // run selected PlugIn (with simulation's current time and step size)
    updateSelectedPlugIn (clock.getTotalSimulationTime (),
                          clock.getElapsedSimulationTime ());

    // redraw selected PlugIn (based on real time)
    redrawSelectedPlugIn (clock.getTotalRealTime (),
                          clock.getElapsedRealTime ());
}